

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O3

value_type * __thiscall
poplar::
map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_bonsai_nlm<int>_>::
find(map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_bonsai_nlm<int>_>
     *this,char_range key)

{
  tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_> tVar1;
  uint64_t node_id;
  undefined8 *puVar2;
  ulong uVar3;
  _Head_base<0UL,_unsigned_char_*,_false> _Var4;
  char *pcVar5;
  byte *pbVar6;
  ulong uVar7;
  ulong uVar8;
  byte *pbVar9;
  
  pbVar6 = key.end;
  pbVar9 = key.begin;
  if (pbVar9 == pbVar6) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar2 = &PTR__exception_00108d90;
    pcVar5 = 
    "/workspace/llm4binary/github/license_c_cmakelists/kampersanda[P]poplar-trie/include/poplar/map.hpp:76:key must be a non-empty string."
    ;
  }
  else {
    if (pbVar6[-1] == 0) {
      if ((this->is_ready_ == true) && ((this->hash_trie_).size_ != 0)) {
        node_id = 1;
        do {
          uVar7 = (long)pbVar6 - (long)pbVar9;
          tVar1.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
               *(_Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_> *)
                &(this->label_store_).ptrs_.
                 super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[node_id]._M_t.
                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>;
          if (uVar7 == 0) {
            if (tVar1.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
                (_Head_base<0UL,_unsigned_char_*,_false>)0x0) {
LAB_00105564:
              return (value_type *)
                     ((long)tVar1.
                            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                            .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + uVar7);
            }
            uVar8 = 0;
          }
          else {
            uVar8 = 0;
            while (pbVar9[uVar8] ==
                   *(byte *)((long)tVar1.
                                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                   .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl +
                            uVar8)) {
              uVar8 = uVar8 + 1;
              if (uVar7 == uVar8) goto LAB_00105564;
            }
          }
          uVar7 = uVar8;
          if (this->lambda_ <= uVar8) {
            do {
              node_id = plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::find_child
                                  (&this->hash_trie_,node_id,0xff);
              if (node_id == 0xffffffffffffffff) goto LAB_00105550;
              uVar7 = uVar7 - this->lambda_;
            } while (this->lambda_ <= uVar7);
          }
          uVar3 = (ulong)(this->codes_)._M_elems[pbVar9[uVar8]];
          if ((uVar3 == 0xff) ||
             (node_id = plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::find_child
                                  (&this->hash_trie_,node_id,uVar7 << 8 | uVar3),
             node_id == 0xffffffffffffffff)) goto LAB_00105550;
          pbVar9 = pbVar9 + uVar8 + 1;
        } while (pbVar9 != pbVar6);
        _Var4._M_head_impl =
             *(uchar **)
              &(this->label_store_).ptrs_.
               super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[node_id]._M_t.
               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>;
      }
      else {
LAB_00105550:
        _Var4._M_head_impl = (uchar *)0x0;
      }
      return (value_type *)
             (_Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
             _Var4._M_head_impl;
    }
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar2 = &PTR__exception_00108d90;
    pcVar5 = 
    "/workspace/llm4binary/github/license_c_cmakelists/kampersanda[P]poplar-trie/include/poplar/map.hpp:77:The last character of key must be the null terminator."
    ;
  }
  puVar2[1] = pcVar5;
  __cxa_throw(puVar2,&exception::typeinfo,std::exception::~exception);
}

Assistant:

explicit map(uint32_t capa_bits, uint64_t lambda = 32) {
        POPLAR_THROW_IF(!is_power2(lambda), "lambda must be a power of 2.");

        is_ready_ = true;
        lambda_ = lambda;
        hash_trie_ = Trie{capa_bits, 8 + bit_tools::ceil_log2(lambda_)};
        label_store_ = NLM{hash_trie_.capa_bits()};
        codes_.fill(UINT8_MAX);
        codes_[0] = static_cast<uint8_t>(num_codes_++);  // terminator
    }